

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFrontNonSym.cpp
# Opt level: O1

void __thiscall
TPZFrontNonSym<std::complex<float>_>::AddKel
          (TPZFrontNonSym<std::complex<float>_> *this,TPZFMatrix<std::complex<float>_> *elmat,
          TPZVec<long> *sourceindex,TPZVec<long> *destinationindex)

{
  _ComplexT _Var1;
  _ComplexT _Var2;
  long lVar3;
  long lVar4;
  long lVar5;
  complex<float> *pcVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  
  lVar3 = sourceindex->fNElements;
  if (0 < lVar3) {
    lVar10 = 0;
    do {
      iVar7 = Local(this,destinationindex->fStore[lVar10]);
      lVar11 = 0;
      do {
        iVar8 = Local(this,destinationindex->fStore[lVar11]);
        lVar4 = sourceindex->fStore[lVar10];
        lVar5 = sourceindex->fStore[lVar11];
        if ((((lVar4 < 0) ||
             ((elmat->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow <= lVar4)) ||
            (lVar5 < 0)) ||
           ((elmat->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fCol <= lVar5)) {
          TPZFMatrix<std::complex<float>_>::Error
                    ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        lVar9 = (long)(this->super_TPZFront<std::complex<float>_>).fMaxFront * (long)iVar8;
        pcVar6 = (this->super_TPZFront<std::complex<float>_>).fData.fStore;
        _Var1 = elmat->fElem
                [lVar5 * (elmat->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow +
                 lVar4]._M_value;
        _Var2 = pcVar6[lVar9 + iVar7]._M_value;
        pcVar6[lVar9 + iVar7]._M_value =
             CONCAT44((float)(_Var2 >> 0x20) + (float)(_Var1 >> 0x20),(float)_Var2 + (float)_Var1);
        lVar11 = lVar11 + 1;
      } while (lVar3 != lVar11);
      lVar10 = lVar10 + 1;
    } while (lVar10 != lVar3);
  }
  return;
}

Assistant:

void TPZFrontNonSym<TVar>::AddKel(TPZFMatrix<TVar> &elmat, TPZVec<int64_t> &sourceindex,  TPZVec<int64_t> &destinationindex)
{
	int64_t i, j, ilocal, jlocal, nel;
	nel=sourceindex.NElements();
	for (i = 0; i < nel; i++) {
		// message #1.1.1 to this:TPZFront
		ilocal = this->Local(destinationindex[i]);
		for (j = 0; j < nel; j++) {
			// message #1.1.2.1 to this:TPZFront
			jlocal = this->Local(destinationindex[j]);
			
			// message #1.1.2.2 to this:TPZFront
			this->Element(ilocal, jlocal)+=elmat(sourceindex[i],sourceindex[j]);
		}
	}
}